

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O1

int __thiscall HevcSpsUnit::short_term_ref_pic_set(HevcSpsUnit *this,uint stRpsIdx)

{
  BitStreamReader *this_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint j;
  
  if (stRpsIdx != 0) {
    this_00 = &(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader;
    bVar1 = BitStreamReader::getBit(this_00);
    if (bVar1) {
      uVar5 = stRpsIdx - 1;
      if (this->num_short_term_ref_pic_sets == stRpsIdx) {
        uVar2 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
        bVar1 = false;
        uVar4 = 0;
        if (uVar2 < stRpsIdx) {
          uVar5 = uVar5 - uVar2;
          goto LAB_0018af68;
        }
      }
      else {
LAB_0018af68:
        BitStreamReader::skipBit(this_00);
        HevcUnit::extractUEGolombCode((HevcUnit *)this);
        uVar4 = 0;
        uVar2 = 0;
        do {
          bVar1 = BitStreamReader::getBit(this_00);
          uVar3 = 1;
          if (!bVar1) {
            bVar1 = BitStreamReader::getBit(this_00);
            uVar3 = (uint)bVar1;
          }
          uVar4 = uVar4 + uVar3;
          uVar2 = uVar2 + 1;
        } while (uVar2 <= (this->num_delta_pocs).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar5]);
        bVar1 = true;
      }
      if (!bVar1) {
        return 1;
      }
      goto LAB_0018b003;
    }
  }
  uVar5 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
  uVar4 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
  uVar4 = uVar4 + uVar5;
  if (0x40 < uVar4) {
    return 1;
  }
  if (uVar4 != 0) {
    uVar5 = uVar4;
    do {
      uVar2 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
      if (0x7fff < uVar2) {
        return 1;
      }
      BitStreamReader::skipBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
LAB_0018b003:
  (this->num_delta_pocs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[stRpsIdx] = uVar4;
  return 0;
}

Assistant:

int HevcSpsUnit::short_term_ref_pic_set(const unsigned stRpsIdx)
{
    unsigned numDeltaPocs = 0;
    const bool inter_ref_pic_set_prediction_flag = stRpsIdx && m_reader.getBit();

    if (inter_ref_pic_set_prediction_flag)
    {
        unsigned refRpsIdx = stRpsIdx - 1;

        if (stRpsIdx == num_short_term_ref_pic_sets)
        {
            const unsigned delta_idx_minus1 = extractUEGolombCode();
            if (delta_idx_minus1 >= stRpsIdx)
                return 1;
            refRpsIdx -= delta_idx_minus1;
        }

        m_reader.skipBit();     // delta_rps_sign
        extractUEGolombCode();  // abs_delta_rps_minus1

        for (unsigned j = 0; j <= num_delta_pocs[refRpsIdx]; j++)
        {
            const bool used = m_reader.getBit();                          // used_by_curr_pic_flag[j]
            const bool use_delta_flag = used ? true : m_reader.getBit();  // use_delta_flag[j]
            if (use_delta_flag)
                numDeltaPocs++;
        }
    }
    else
    {
        // numDeltaPocs = num_negative_pics + num_positive_pics
        numDeltaPocs = extractUEGolombCode() + extractUEGolombCode();
        if (numDeltaPocs > 64)
            return 1;

        for (unsigned i = 0; i < numDeltaPocs; i++)
        {
            if (extractUEGolombCode() >= 0x8000)  // delta_poc_minus1[i]
                return 1;
            m_reader.skipBit();  // used_by_curr_pic_flag[i]
        }
    }
    num_delta_pocs[stRpsIdx] = numDeltaPocs;

    return 0;
}